

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcEdgeCurve::IfcEdgeCurve(IfcEdgeCurve *this)

{
  *(undefined ***)&this->field_0x78 = &PTR__Object_00806870;
  *(undefined8 *)&this->field_0x80 = 0;
  *(char **)&this->field_0x88 = "IfcEdgeCurve";
  IfcEdge::IfcEdge(&this->super_IfcEdge,&PTR_construction_vtable_24__0081da68);
  *(undefined8 *)&(this->super_IfcEdge).field_0x48 = 0;
  *(undefined8 *)&(this->super_IfcEdge).field_0x50 = 0;
  (this->super_IfcEdge).super_IfcTopologicalRepresentationItem.super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0x81d9b0;
  *(undefined8 *)&this->field_0x78 = 0x81da50;
  *(undefined8 *)
   &(this->super_IfcEdge).super_IfcTopologicalRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0x81d9d8;
  *(undefined8 *)
   &(this->super_IfcEdge).super_IfcTopologicalRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 = 0x81da00;
  *(undefined8 *)&(this->super_IfcEdge).field_0x40 = 0x81da28;
  (this->SameSense)._M_dataplus._M_p = (pointer)&(this->SameSense).field_2;
  (this->SameSense)._M_string_length = 0;
  (this->SameSense).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

IfcEdgeCurve() : Object("IfcEdgeCurve") {}